

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureDataManager.cpp
# Opt level: O0

bool __thiscall
SecureDataManager::reAuthenticate
          (SecureDataManager *this,ByteString *passphrase,ByteString *encryptedKey)

{
  undefined1 uVar1;
  byte bVar2;
  long in_RDI;
  ByteString finalBlock;
  ByteString decryptedKeyData;
  AESKey *pbeKey;
  ByteString encryptedKeyData;
  ByteString IV;
  ByteString salt;
  undefined7 in_stack_fffffffffffffe48;
  ByteString *compareTo;
  ByteString *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  uint uVar3;
  byte in_stack_fffffffffffffe64;
  byte in_stack_fffffffffffffe65;
  byte bVar4;
  size_t in_stack_fffffffffffffe68;
  long *len;
  size_t in_stack_fffffffffffffe70;
  ByteString *start;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  AESKey **in_stack_fffffffffffffeb8;
  ByteString *in_stack_fffffffffffffec0;
  ByteString *in_stack_fffffffffffffec8;
  undefined1 local_130 [40];
  undefined1 local_108 [40];
  undefined1 local_e0 [44];
  undefined4 local_b4;
  ByteString *local_b0;
  undefined1 local_a8 [56];
  undefined1 local_70 [111];
  byte local_1;
  
  ByteString::substr((ByteString *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                     in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  (**(code **)(**(long **)(in_RDI + 0xc0) + 0x68))();
  ByteString::substr((ByteString *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                     in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  (**(code **)(**(long **)(in_RDI + 0xc0) + 0x68))();
  ByteString::substr((ByteString *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                     in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  local_b0 = (ByteString *)0x0;
  uVar1 = RFC4880::PBEDeriveKey
                    (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if ((bool)uVar1) {
    ByteString::ByteString((ByteString *)0x1c9067);
    ByteString::ByteString((ByteString *)0x1c9076);
    len = *(long **)(in_RDI + 0xc0);
    start = local_b0;
    ByteString::ByteString((ByteString *)0x1c90a3);
    bVar2 = (**(code **)(*len + 0x28))(len,start,1,local_70,1,0,local_130,0);
    bVar4 = 1;
    if ((bVar2 & 1) != 0) {
      in_stack_fffffffffffffe65 =
           (**(code **)(**(long **)(in_RDI + 0xc0) + 0x30))
                     (*(long **)(in_RDI + 0xc0),local_a8,local_e0);
      bVar4 = 1;
      if ((in_stack_fffffffffffffe65 & 1) != 0) {
        in_stack_fffffffffffffe64 =
             (**(code **)(**(long **)(in_RDI + 0xc0) + 0x38))(*(long **)(in_RDI + 0xc0),local_108);
        bVar4 = in_stack_fffffffffffffe64 ^ 0xff;
      }
    }
    uVar3 = CONCAT13(bVar4,(int3)in_stack_fffffffffffffe60);
    ByteString::~ByteString((ByteString *)0x1c9179);
    if ((uVar3 & 0x1000000) == 0) {
      compareTo = local_b0;
      if (local_b0 != (ByteString *)0x0) {
        (*local_b0->_vptr_ByteString[2])();
      }
      ByteString::operator+=
                ((ByteString *)
                 CONCAT17(bVar2,CONCAT16(bVar4,CONCAT15(in_stack_fffffffffffffe65,
                                                        CONCAT14(in_stack_fffffffffffffe64,uVar3))))
                 ,in_stack_fffffffffffffe58);
      ByteString::substr((ByteString *)CONCAT17(uVar1,in_stack_fffffffffffffe78),(size_t)start,
                         (size_t)len);
      bVar2 = ByteString::operator!=(in_stack_fffffffffffffe58,compareTo);
      ByteString::~ByteString((ByteString *)0x1c928c);
      if ((bVar2 & 1) == 0) {
        ByteString::wipe(compareTo,CONCAT17(bVar2,in_stack_fffffffffffffe48));
        local_1 = 1;
      }
      else {
        softHSMLog(7,"reAuthenticate",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/data_mgr/SecureDataManager.cpp"
                   ,0x16a,"Incorrect passphrase supplied");
        local_1 = 0;
      }
    }
    else {
      if (local_b0 != (ByteString *)0x0) {
        (*local_b0->_vptr_ByteString[2])();
      }
      local_1 = 0;
    }
    local_b4 = 1;
    ByteString::~ByteString((ByteString *)0x1c9326);
    ByteString::~ByteString((ByteString *)0x1c9333);
  }
  else {
    local_1 = 0;
    local_b4 = 1;
  }
  ByteString::~ByteString((ByteString *)0x1c935e);
  ByteString::~ByteString((ByteString *)0x1c936b);
  ByteString::~ByteString((ByteString *)0x1c9378);
  return (bool)(local_1 & 1);
}

Assistant:

bool SecureDataManager::reAuthenticate(const ByteString& passphrase, const ByteString& encryptedKey)
{
	// First, take the salt from the encrypted key
	ByteString salt = encryptedKey.substr(0,8);

	// Then, take the IV from the encrypted key
	ByteString IV = encryptedKey.substr(8, aes->getBlockSize());

	// Now, take the encrypted data from the encrypted key
	ByteString encryptedKeyData = encryptedKey.substr(8 + aes->getBlockSize());

	// Derive the PBE key
	AESKey* pbeKey = NULL;

	if (!RFC4880::PBEDeriveKey(passphrase, salt, &pbeKey))
	{
		return false;
	}

	// Decrypt the key data
	ByteString decryptedKeyData;
	ByteString finalBlock;

	// NOTE: The login will fail here if incorrect passphrase is supplied
	if (!aes->decryptInit(pbeKey, SymMode::CBC, IV) ||
	    !aes->decryptUpdate(encryptedKeyData, decryptedKeyData) ||
	    !aes->decryptFinal(finalBlock))
	{
		delete pbeKey;

		return false;
	}

	delete pbeKey;

	decryptedKeyData += finalBlock;

	// Check the magic
	if (decryptedKeyData.substr(0, 3) != magic)
	{
		// The passphrase was incorrect
		DEBUG_MSG("Incorrect passphrase supplied");

		return false;
	}

	// And mask the key
	decryptedKeyData.wipe();

	return true;
}